

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O1

void __thiscall
helics::EndpointInfo::addSource
          (EndpointInfo *this,GlobalHandle source,string_view sourceName,string_view sourceType)

{
  pointer pEVar1;
  pointer pEVar2;
  pointer pEVar3;
  bool bVar4;
  GlobalHandle local_28;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_20._M_str = sourceType._M_str;
  local_20._M_len = sourceType._M_len;
  local_10._M_str = sourceName._M_str;
  local_10._M_len = sourceName._M_len;
  pEVar1 = (this->sourceInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->sourceInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = pEVar1 == pEVar2;
  if (!bVar4) {
    if (((pEVar1->id).fed_id.gid != source.fed_id.gid.gid) ||
       ((pEVar1->id).handle.hid != source.handle.hid.hid)) {
      pEVar1 = pEVar1 + 1;
      do {
        pEVar3 = pEVar1;
        bVar4 = pEVar3 == pEVar2;
        if (bVar4) goto LAB_002da69b;
        pEVar1 = pEVar3 + 1;
      } while (((pEVar3->id).fed_id.gid != source.fed_id.gid.gid) ||
              ((pEVar3->id).handle.hid != source.handle.hid.hid));
    }
    if (!bVar4) {
      return;
    }
  }
LAB_002da69b:
  local_28 = source;
  std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>::
  emplace_back<helics::GlobalHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>> *)
             &this->sourceInformation,&local_28,&local_10,&local_20);
  return;
}

Assistant:

void EndpointInfo::addSource(GlobalHandle source,
                             std::string_view sourceName,
                             std::string_view sourceType)
{
    for (const auto& info : sourceInformation) {
        if (info.id == source) {
            return;
        }
    }
    sourceInformation.emplace_back(source, sourceName, sourceType);
}